

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

int matchone(regex_t p,char c)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = p._0_4_ & 0xff;
  switch(uVar1) {
  case 1:
    goto switchD_00114ba4_caseD_1;
  default:
    bVar3 = (p.u._0_4_ & 0xff) == (int)c;
    goto LAB_00114c03;
  case 8:
    iVar2 = matchcharclass(c,(char *)p.u.ccl);
    return iVar2;
  case 9:
    uVar1 = matchcharclass(c,(char *)p.u.ccl);
    break;
  case 10:
    iVar2 = matchdigit(c);
    return iVar2;
  case 0xb:
    iVar2 = matchdigit(c);
    goto LAB_00114bf0;
  case 0xc:
    iVar2 = matchalphanum(c);
    return iVar2;
  case 0xd:
    uVar1 = matchalphanum(c);
    break;
  case 0xe:
    iVar2 = matchwhitespace(c);
    return iVar2;
  case 0xf:
    iVar2 = matchwhitespace(c);
LAB_00114bf0:
    bVar3 = iVar2 == 0;
LAB_00114c03:
    uVar1 = (uint)bVar3;
    goto switchD_00114ba4_caseD_1;
  }
  uVar1 = uVar1 ^ 1;
switchD_00114ba4_caseD_1:
  return uVar1;
}

Assistant:

static int matchone(regex_t p, char c)
{
  switch (p.type)
  {
    case DOT:            return matchdot(c);
    case CHAR_CLASS:     return  matchcharclass(c, (const char*)p.u.ccl);
    case INV_CHAR_CLASS: return !matchcharclass(c, (const char*)p.u.ccl);
    case DIGIT:          return  matchdigit(c);
    case NOT_DIGIT:      return !matchdigit(c);
    case ALPHA:          return  matchalphanum(c);
    case NOT_ALPHA:      return !matchalphanum(c);
    case WHITESPACE:     return  matchwhitespace(c);
    case NOT_WHITESPACE: return !matchwhitespace(c);
    default:             return  (p.u.ch == c);
  }
}